

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O0

_Bool bitset_array_container_ixor
                (bitset_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  uint64_t uVar2;
  array_container_t *paVar3;
  bitset_container_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  
  *(int **)in_RDX = in_RDI;
  uVar2 = bitset_flip_list_withcard
                    (*(uint64_t **)(in_RDI + 2),(long)*in_RDI,*(uint16_t **)(in_RSI + 2),
                     (long)*in_RSI);
  *in_RDI = (int)uVar2;
  iVar1 = *in_RDI;
  if (0x1000 >= iVar1) {
    paVar3 = array_container_from_bitset(in_RDX);
    *(array_container_t **)in_RDX = paVar3;
    bitset_container_free((bitset_container_t *)0x16d07c);
  }
  return 0x1000 < iVar1;
}

Assistant:

bool bitset_array_container_ixor(bitset_container_t *src_1,
                                 const array_container_t *src_2,
                                 container_t **dst) {
    *dst = src_1;
    src_1->cardinality = (uint32_t)bitset_flip_list_withcard(
        src_1->words, src_1->cardinality, src_2->array, src_2->cardinality);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}